

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

bool sqlcheck::IsDDLStatement(string *sql_statement)

{
  long lVar1;
  allocator local_81;
  string local_80 [8];
  string alter_table_template;
  size_t found;
  allocator local_39;
  string local_38 [8];
  string create_table_template;
  string *sql_statement_local;
  
  create_table_template.field_2._8_8_ = sql_statement;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"create table",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar1 = std::__cxx11::string::find((string *)create_table_template.field_2._8_8_,(ulong)local_38);
  if (lVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"alter table",&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    lVar1 = std::__cxx11::string::find
                      ((string *)create_table_template.field_2._8_8_,(ulong)local_80);
    sql_statement_local._7_1_ = lVar1 != -1;
    alter_table_template.field_2._12_4_ = 1;
    std::__cxx11::string::~string(local_80);
  }
  else {
    sql_statement_local._7_1_ = true;
    alter_table_template.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string(local_38);
  return sql_statement_local._7_1_;
}

Assistant:

bool IsDDLStatement(const std::string& sql_statement){
  std::string create_table_template = "create table";
  std::size_t found = sql_statement.find(create_table_template);
  if (found != std::string::npos) {
    return true;
  }

  std::string alter_table_template = "alter table";
  found = sql_statement.find(alter_table_template);
  if (found != std::string::npos) {
    return true;
  }

  return false;
}